

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall
ON_PolyCurve::GetCurveParameterFromNurbFormParameter
          (ON_PolyCurve *this,double nurbs_t,double *curve_t)

{
  double *pdVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ON_Curve *pOVar7;
  double dVar8;
  ON_Interval cdom;
  ON_Interval in;
  ON_Interval local_40;
  ON_Interval local_30;
  
  iVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar4 = ON_SearchMonotoneArray((this->m_t).m_a,(this->m_t).m_count,nurbs_t);
  uVar6 = iVar5 - 1;
  if ((int)uVar4 < iVar5) {
    uVar6 = uVar4;
  }
  pOVar7 = (ON_Curve *)0x0;
  if ((int)uVar4 < 0) {
    uVar6 = 0;
  }
  if ((-1 < (int)uVar6) && ((int)uVar6 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)
     ) {
    pOVar7 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6];
  }
  if (pOVar7 == (ON_Curve *)0x0) {
    cVar3 = '\0';
  }
  else {
    pdVar1 = (this->m_t).m_a;
    dVar8 = pdVar1[(long)(int)uVar6 + 1];
    ON_Interval::ON_Interval(&local_30,pdVar1[(int)uVar6],dVar8);
    (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar7);
    local_40.m_t[1] = dVar8;
    bVar2 = ON_Interval::operator!=(&local_30,&local_40);
    if (bVar2) {
      ON_Interval::TransformParameterTo(&local_30,&local_40,nurbs_t);
      iVar5 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])(pOVar7,curve_t);
      cVar3 = (char)iVar5;
      if (cVar3 != '\0') {
        dVar8 = ON_Interval::TransformParameterTo(&local_40,&local_30,*curve_t);
        *curve_t = dVar8;
      }
    }
    else {
      iVar5 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])
                        (nurbs_t,pOVar7,curve_t);
      cVar3 = (char)iVar5;
    }
  }
  return (bool)cVar3;
}

Assistant:

bool ON_PolyCurve::GetCurveParameterFromNurbFormParameter(
      double nurbs_t,
      double* curve_t
      ) const
{
  bool rc = false;
  int i = SegmentIndex( nurbs_t );
  const ON_Curve* curve = SegmentCurve(i);
  if ( curve ) {
    ON_Interval in( m_t[i], m_t[i+1] );
    ON_Interval cdom = curve->Domain();
    if ( in != cdom ) {

      nurbs_t = in.TransformParameterTo(cdom, nurbs_t);
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
      if (rc)
        *curve_t = cdom.TransformParameterTo(in, *curve_t);
    }
    else {
      rc = curve->GetCurveParameterFromNurbFormParameter(nurbs_t,curve_t);
    }
  }
  return rc;
}